

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O1

int VP8LDistanceToPlaneCode(int xsize,int dist)

{
  int iVar1;
  int iVar2;
  
  iVar1 = dist / xsize;
  iVar2 = dist % xsize;
  if (iVar1 < 8 && iVar2 < 9) {
    iVar2 = (iVar1 << 4 | 8U) - iVar2;
  }
  else {
    if (6 < iVar1 || iVar2 <= xsize + -8) {
      return dist + 0x78;
    }
    iVar2 = ((xsize + iVar1 * 0x10) - iVar2) + 0x18;
  }
  return plane_to_code_lut[iVar2] + 1;
}

Assistant:

int VP8LDistanceToPlaneCode(int xsize, int dist) {
  const int yoffset = dist / xsize;
  const int xoffset = dist - yoffset * xsize;
  if (xoffset <= 8 && yoffset < 8) {
    return plane_to_code_lut[yoffset * 16 + 8 - xoffset] + 1;
  } else if (xoffset > xsize - 8 && yoffset < 7) {
    return plane_to_code_lut[(yoffset + 1) * 16 + 8 + (xsize - xoffset)] + 1;
  }
  return dist + 120;
}